

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.h
# Opt level: O2

void __thiscall enact::ParametricTypename::~ParametricTypename(ParametricTypename *this)

{
  (this->super_Typename)._vptr_Typename = (_func_int **)&PTR__ParametricTypename_00124910;
  std::__cxx11::string::~string((string *)&this->m_name);
  std::
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  ::~vector(&this->m_parameterTypenames);
  std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::~unique_ptr
            (&this->m_constructorTypename);
  return;
}

Assistant:

~ParametricTypename() override = default;